

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaro_impl.hpp
# Opt level: O0

void duckdb_jaro_winkler::detail::flag_similar_characters_step<char>
               (BlockPatternMatchVector *PM,char T_j,FlaggedCharsMultiword *flagged,int64_t j,
               SearchBoundMask BoundMask)

{
  size_type __n;
  uint64_t uVar1;
  reference pvVar2;
  ulong uVar3;
  unsigned_long uVar4;
  byte bVar5;
  long in_RCX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  long in_stack_00000008;
  size_type in_stack_00000010;
  ulong in_stack_00000018;
  ulong in_stack_00000020;
  uint64_t PM_j_3;
  uint64_t PM_j_2;
  uint64_t PM_j_1;
  uint64_t PM_j;
  int64_t last_word;
  int64_t word;
  int64_t j_pos;
  int64_t j_word;
  undefined8 in_stack_ffffffffffffff38;
  char key;
  int64_t in_stack_ffffffffffffff40;
  BlockPatternMatchVector *in_stack_ffffffffffffff48;
  size_type local_38;
  
  __n = in_RCX / 0x40;
  local_38 = in_stack_00000010;
  key = (char)((ulong)in_stack_ffffffffffffff38 >> 0x38);
  bVar5 = (byte)(in_RCX % 0x40);
  if (in_stack_00000008 == 1) {
    uVar1 = common::BlockPatternMatchVector::get<char>
                      (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,key);
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_RDX,in_stack_00000010);
    uVar3 = uVar1 & in_stack_00000018 & in_stack_00000020 & (*pvVar2 ^ 0xffffffffffffffff);
    uVar4 = intrinsics::blsi<unsigned_long>(uVar3);
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_RDX,in_stack_00000010);
    *pvVar2 = uVar4 | *pvVar2;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDX + 1,__n);
    *pvVar2 = (ulong)(uVar3 != 0) << (bVar5 & 0x3f) | *pvVar2;
  }
  else {
    if (in_stack_00000020 != 0) {
      uVar1 = common::BlockPatternMatchVector::get<char>
                        (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,key);
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_RDX,in_stack_00000010);
      uVar3 = uVar1 & in_stack_00000020 & (*pvVar2 ^ 0xffffffffffffffff);
      if (uVar3 != 0) {
        uVar4 = intrinsics::blsi<unsigned_long>(uVar3);
        pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_RDX,in_stack_00000010);
        *pvVar2 = uVar4 | *pvVar2;
        pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_RDX + 1,__n);
        *pvVar2 = 1L << (bVar5 & 0x3f) | *pvVar2;
        return;
      }
      local_38 = in_stack_00000010 + 1;
    }
    for (; (long)local_38 < (long)(in_stack_00000010 + in_stack_00000008 + -1);
        local_38 = local_38 + 1) {
      uVar1 = common::BlockPatternMatchVector::get<char>
                        (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,key);
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_RDX,local_38);
      uVar3 = uVar1 & (*pvVar2 ^ 0xffffffffffffffff);
      if (uVar3 != 0) {
        uVar4 = intrinsics::blsi<unsigned_long>(uVar3);
        pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_RDX,local_38);
        *pvVar2 = uVar4 | *pvVar2;
        pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_RDX + 1,__n);
        *pvVar2 = 1L << (bVar5 & 0x3f) | *pvVar2;
        return;
      }
    }
    if (in_stack_00000018 != 0) {
      uVar1 = common::BlockPatternMatchVector::get<char>
                        (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,key);
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_RDX,local_38);
      uVar3 = uVar1 & in_stack_00000018 & (*pvVar2 ^ 0xffffffffffffffff);
      uVar4 = intrinsics::blsi<unsigned_long>(uVar3);
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_RDX,local_38);
      *pvVar2 = uVar4 | *pvVar2;
      uVar3 = (ulong)(uVar3 != 0) << (bVar5 & 0x3f);
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_RDX + 1,__n);
      *pvVar2 = uVar3 | *pvVar2;
    }
  }
  return;
}

Assistant:

static inline void flag_similar_characters_step(const common::BlockPatternMatchVector& PM,
                                                CharT T_j, FlaggedCharsMultiword& flagged,
                                                int64_t j, SearchBoundMask BoundMask)
{
    using namespace intrinsics;

    int64_t j_word = j / 64;
    int64_t j_pos = j % 64;
    int64_t word = BoundMask.empty_words;
    int64_t last_word = word + BoundMask.words;

    if (BoundMask.words == 1) {
        uint64_t PM_j = PM.get(word, T_j) & BoundMask.last_mask & BoundMask.first_mask &
                        (~flagged.P_flag[static_cast<size_t>(word)]);

        flagged.P_flag[static_cast<size_t>(word)] |= blsi(PM_j);
        flagged.T_flag[static_cast<size_t>(j_word)] |= static_cast<uint64_t>(PM_j != 0) << j_pos;
        return;
    }

    if (BoundMask.first_mask) {
        uint64_t PM_j = PM.get(word, T_j) & BoundMask.first_mask & (~flagged.P_flag[static_cast<size_t>(word)]);

        if (PM_j) {
            flagged.P_flag[static_cast<size_t>(word)] |= blsi(PM_j);
            flagged.T_flag[static_cast<size_t>(j_word)] |= 1ull << j_pos;
            return;
        }
        word++;
    }

    for (; word < last_word - 1; ++word) {
        uint64_t PM_j = PM.get(word, T_j) & (~flagged.P_flag[static_cast<size_t>(word)]);

        if (PM_j) {
            flagged.P_flag[static_cast<size_t>(word)] |= blsi(PM_j);
            flagged.T_flag[static_cast<size_t>(j_word)] |= 1ull << j_pos;
            return;
        }
    }

    if (BoundMask.last_mask) {
        uint64_t PM_j = PM.get(word, T_j) & BoundMask.last_mask & (~flagged.P_flag[static_cast<size_t>(word)]);

        flagged.P_flag[static_cast<size_t>(word)] |= blsi(PM_j);
        flagged.T_flag[static_cast<size_t>(j_word)] |= static_cast<uint64_t>(PM_j != 0) << j_pos;
    }
}